

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

bool __thiscall
MapLoader::validateCountryLine
          (MapLoader *this,int *countryCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryID,int *continentCount,bool verbose)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer __str;
  
  *countryCount = *countryCount + 1;
  __str = (lineWords->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__str;
  if (uVar2 < 0x41) {
    if (!verbose) goto LAB_001153b8;
    poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
    pcVar4 = 
    " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n"
    ;
  }
  else {
    if (verbose && uVar2 != 0x60) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
      std::operator<<(poVar3,
                      " - [WARNING] : a line in  the countries declaration had extra tokens.\n");
      __str = (lineWords->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    }
    iVar1 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    if ((iVar1 == *countryID) &&
       (iVar1 = std::__cxx11::stoi((lineWords->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10),
       iVar1 <= *continentCount)) {
      *countryID = *countryID + 1;
      return true;
    }
    if (!verbose) goto LAB_001153b8;
    poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
    pcVar4 = " - [ERROR] : a country or continent ID did was invalid.\n";
  }
  std::operator<<(poVar3,pcVar4);
LAB_001153b8:
  *validMap = false;
  return false;
}

Assistant:

bool MapLoader::validateCountryLine(int* countryCount, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap,
                               int* countryID, const int* continentCount,bool verbose) {
    (*countryCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 3) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        if (lineWords->size() > 3 && verbose)
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the countries declaration had extra tokens.\n";
        //check country id matches with order and that it references a valid continent
        if (std::stoi((*lineWords)[0]) == *countryID && std::stoi((*lineWords)[2]) <= *continentCount) {
            (*countryID)++;
            return true;
        } else {
            if(verbose){
                std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
            }
            *validMap = false;
            return false;
        }
    }
}